

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void __thiscall boost::detail::thread_data_base::~thread_data_base(thread_data_base *this)

{
  pointer ppVar1;
  pointer psVar2;
  type this_00;
  pointer this_01;
  pointer ppVar3;
  
  this->_vptr_thread_data_base = (_func_int **)&PTR__thread_data_base_001e35a8;
  ppVar1 = (this->notify).
           super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->notify).
                super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    mutex::unlock(ppVar3->second);
    condition_variable::notify_all(ppVar3->first);
  }
  psVar2 = (this->async_states_).
           super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->async_states_).
                 super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar2; this_01 = this_01 + 1
      ) {
    this_00 = shared_ptr<boost::detail::shared_state_base>::operator->(this_01);
    shared_state_base::notify_deferred(this_00);
  }
  std::
  vector<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ::~vector(&this->async_states_);
  std::
  _Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ::~_Vector_base(&(this->notify).
                   super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
                 );
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_boost::detail::tss_data_node>,_std::_Select1st<std::pair<const_void_*const,_boost::detail::tss_data_node>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
  ::~_Rb_tree(&(this->tss_data)._M_t);
  condition_variable::~condition_variable(&this->sleep_condition);
  mutex::~mutex(&this->sleep_mutex);
  condition_variable::~condition_variable(&this->done_condition);
  mutex::~mutex(&this->data_mutex);
  shared_count::~shared_count(&(this->self).pn);
  weak_count::~weak_count
            (&(this->super_enable_shared_from_this<boost::detail::thread_data_base>).weak_this_.pn);
  return;
}

Assistant:

thread_data_base::~thread_data_base()
        {
            for (notify_list_t::iterator i = notify.begin(), e = notify.end();
                    i != e; ++i)
            {
                i->second->unlock();
                i->first->notify_all();
            }
            for (async_states_t::iterator i = async_states_.begin(), e = async_states_.end();
                    i != e; ++i)
            {
                (*i)->notify_deferred();
            }
        }